

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsortL.c
# Opt level: O1

int bursttraverseL(TRIE *node,uchar **strings,int pos,int deep)

{
  trierec *node_00;
  uint uVar1;
  int deep_00;
  uint n;
  long lVar2;
  
  deep_00 = deep + 1;
  lVar2 = 0;
  do {
    node_00 = node->ptrs[lVar2];
    uVar1 = pos;
    if (node->counts[lVar2] < 0) {
      uVar1 = bursttraverseL(node_00,strings,pos,deep_00);
    }
    else {
      for (; node_00 != (TRIE *)0x0; node_00 = node_00->ptrs[1]) {
        strings[uVar1] = (uchar *)node_00->ptrs[0];
        uVar1 = uVar1 + 1;
      }
      if ((lVar2 != 0) && (n = uVar1 - pos, 1 < n)) {
        if (n < 0x14) {
          inssort(strings + pos,n,deep_00);
        }
        else {
          mkqsort(strings + pos,n,deep_00);
        }
      }
    }
    pos = uVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  free(node);
  return pos;
}

Assistant:

static int
bursttraverseL(TRIE *node, unsigned char **strings, int pos, int deep)
{
    LIST	*l;
    unsigned int i, off;
    unsigned int sizeOfContainer = 0;

    for( i=0 ; i<ALPHABET ; i++ )
    {
        if( node->counts[i]<0 )
        {
            pos = bursttraverseL(node->ptrs[i], strings, pos, deep+1);
	    }
        else
        {
            for( off=pos, l=(LIST *) node->ptrs[i] ; l!=NULL ; off++, l=l->next )
            {
                strings[off] = l->word;
            }
            sizeOfContainer = (off - pos); 

            if( i>0 && sizeOfContainer > 1 )
            {
                if (sizeOfContainer < INSERTBREAK)
                    inssort( strings+pos, off-pos, deep + 1);     
                else
                    mkqsort( strings+pos, off-pos, deep + 1);
            }
            pos = off;
        }
    }
    free(node);
    return pos;
}